

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::GeneratorsForTest::~GeneratorsForTest(GeneratorsForTest *this)

{
  ~GeneratorsForTest(this);
  operator_delete(this);
  return;
}

Assistant:

~GeneratorsForTest() {
			deleteAll(m_generatorsInOrder);
		}